

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::~TextureCubeArrayFilteringCase
          (TextureCubeArrayFilteringCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeArrayFilteringCase_01e4e140;
  deinit(this);
  std::
  _Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
  ::~_Vector_base(&(this->m_cases).
                   super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
                 );
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer(&this->m_renderer);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

TextureCubeArrayFilteringCase::~TextureCubeArrayFilteringCase (void)
{
	TextureCubeArrayFilteringCase::deinit();
}